

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlitePagerRollback(Pager *pPager,int bResetKvEngine)

{
  sxi32 *psVar1;
  unqlite_kv_engine *pSrc;
  Page *pPVar2;
  unqlite_kv_io *puVar3;
  unqlite *pDb;
  int iVar4;
  unqlite_kv_methods *puVar5;
  Page *pPage;
  unqlite_file *puVar6;
  
  if (pPager->iState < 2) {
    return 0;
  }
  if (pPager->is_mem != 0) {
    return 0;
  }
  if (pPager->is_rdonly != 0) {
    unqliteGenError(pPager->pDb,"Read-Only database");
    return -0x4b;
  }
  if (pPager->iState == 2) {
    pager_unlock_db(pPager,1);
    pPager->iState = 1;
    return 0;
  }
  if (pPager->no_jrnl == 0) {
    puVar6 = pPager->pjfd;
    if (puVar6 == (unqlite_file *)0x0) {
      puVar6 = (unqlite_file *)0x0;
    }
    else {
      (*puVar6->pMethods->xSync)(puVar6,2);
      puVar6 = pPager->pjfd;
    }
    unqliteOsCloseFree(pPager->pAllocator,puVar6);
    pPager->pjfd = (unqlite_file *)0x0;
    if (((pPager->iFlags & 3) != 0) && (iVar4 = pager_journal_rollback(pPager,0), iVar4 != 0)) {
      psVar1 = &pPager->pDb->iFlags;
      *psVar1 = *psVar1 | 1;
      return iVar4;
    }
  }
  (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
  pSrc = pPager->pEngine;
  *(byte *)&pPager->iFlags = (byte)pPager->iFlags & 0xfc;
  pPager->iJournalOfft = 0;
  pPager->nRec = 0;
  pPager->dbSize = pPager->dbOrigSize;
  pPage = pPager->pAll;
  while (pPage != (Page *)0x0) {
    pPVar2 = pPage->pNext;
    *(byte *)&pPage->flags = (byte)pPage->flags & 0x91;
    pager_release_page(pPager,pPage);
    pPage = pPVar2;
  }
  pPager->nPage = 0;
  pPager->pFirstDirty = (Page *)0x0;
  pPager->pDirty = (Page *)0x0;
  pPager->pAll = (Page *)0x0;
  pPager->pHotDirty = (Page *)0x0;
  *(undefined8 *)((long)&pPager->pHotDirty + 4) = 0;
  *(undefined8 *)((long)&pPager->pFirstHot + 4) = 0;
  if (pPager->apHash != (Page **)0x0) {
    SyZero(pPager->apHash,pPager->nSize << 3);
  }
  if (pPager->pVec != (Bitvec *)0x0) {
    unqliteBitvecDestroy(pPager->pVec);
    pPager->pVec = (Bitvec *)0x0;
  }
  pager_unlock_db(pPager,1);
  pPager->iState = 1;
  if (bResetKvEngine == 0) {
    return 0;
  }
  puVar3 = pSrc->pIo;
  puVar5 = puVar3->pMethods;
  if (puVar5->xRelease != (_func_void_unqlite_kv_engine_ptr *)0x0) {
    (*puVar5->xRelease)(pSrc);
    puVar5 = puVar3->pMethods;
  }
  SyZero(pSrc,puVar5->szKv);
  pSrc->pIo = puVar3;
  puVar5 = puVar3->pMethods;
  if (puVar5->xInit != (_func_int_unqlite_kv_engine_ptr_int *)0x0) {
    iVar4 = (*puVar5->xInit)(pSrc,pPager->iPageSize);
    if (iVar4 != 0) goto LAB_0010e1b5;
    puVar5 = puVar3->pMethods;
  }
  if (puVar5->xOpen == (_func_int_unqlite_kv_engine_ptr_pgno *)0x0) {
    return 0;
  }
  iVar4 = (*puVar5->xOpen)(pSrc,pPager->dbSize);
  if (iVar4 == 0) {
    return 0;
  }
LAB_0010e1b5:
  pDb = pPager->pDb;
  psVar1 = &pDb->iFlags;
  *psVar1 = *psVar1 | 1;
  unqliteGenError(pDb,"Error while reseting pager to its initial state");
  return iVar4;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerRollback(Pager *pPager,int bResetKvEngine)
{
	int rc = UNQLITE_OK;
	if( pPager->iState < PAGER_WRITER_LOCKED ){
		/* A write transaction must be opened */
		return UNQLITE_OK;
	}
	if( pPager->is_mem ){
		/* As of this release 1.1.6: Transactions are not supported for in-memory databases */
		return UNQLITE_OK;
	}
	if( pPager->is_rdonly ){
		/* Read-Only DB */
		unqliteGenError(pPager->pDb,"Read-Only database");
		return UNQLITE_READ_ONLY;
	}
	if( pPager->iState >= PAGER_WRITER_CACHEMOD ){
		if( !pPager->no_jrnl ){
			/* Close any outstanding joural file */
			if( pPager->pjfd ){
				/* Sync the journal file */
				unqliteOsSync(pPager->pjfd,UNQLITE_SYNC_NORMAL);
			}
			unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
			pPager->pjfd = 0;
			if( pPager->iFlags & (PAGER_CTRL_COMMIT_ERR|PAGER_CTRL_DIRTY_COMMIT) ){
				/* Perform the rollback */
				rc = pager_journal_rollback(pPager,0);
				if( rc != UNQLITE_OK ){
					/* Set the auto-commit flag */
					pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT;
					return rc;
				}
			}
		}
		/* Unlink the journal file */
		unqliteOsDelete(pPager->pVfs,pPager->zJournal,1);
		/* Reset the pager state */
		rc = pager_reset_state(pPager,bResetKvEngine);
		if( rc != UNQLITE_OK ){
			/* Mostly an unlikely scenario */
			pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT; /* Set the auto-commit flag */
			unqliteGenError(pPager->pDb,"Error while reseting pager to its initial state");
			return rc;
		}
	}else{
		/* Downgrade to shared lock */
		pager_unlock_db(pPager,SHARED_LOCK);
		pPager->iState = PAGER_READER;
	}
	return UNQLITE_OK;
}